

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::addMaterial(XMLLoader *this,string *type,Parms *parms)

{
  int iVar1;
  ostream *poVar2;
  OBJMaterial *pOVar3;
  MetalMaterial *this_00;
  Parms *in_RCX;
  _Alloc_hider _Var4;
  float fVar5;
  float fVar6;
  Vec3fa Kt;
  Vec3fa Kr;
  Vec3fa k;
  shared_ptr<embree::Texture> map_Kt;
  shared_ptr<embree::Texture> map_Ks;
  shared_ptr<embree::Texture> map_Kd;
  shared_ptr<embree::Texture> local_138;
  shared_ptr<embree::Texture> local_128;
  shared_ptr<embree::Texture> local_118;
  shared_ptr<embree::Texture> local_108;
  shared_ptr<embree::Texture> local_f8;
  shared_ptr<embree::Texture> local_e8;
  shared_ptr<embree::Texture> local_d8;
  shared_ptr<embree::Texture> map_Displ;
  shared_ptr<embree::Texture> map_Ns;
  Vec3fa Kd_1;
  string local_98;
  string local_78;
  Vec3fa Kt_1;
  Vec3fa Ks_1;
  
  iVar1 = std::__cxx11::string::compare((char *)parms);
  if (iVar1 == 0) {
    Kt.field_0._0_8_ = 0x3f8000003f800000;
    Kt.field_0._8_8_ = 0x3f8000003f800000;
    Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"reflectance");
    this_00 = (MetalMaterial *)alignedUSMMalloc(0x90,0x10,DEVICE_READ_ONLY);
    MatteMaterial::MatteMaterial((MatteMaterial *)this_00,&Kr);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)parms);
    if (iVar1 == 0) {
      Kt.field_0._0_8_ = 0x3f8000003f800000;
      Kt.field_0._8_8_ = 0x3f8000003f800000;
      Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"reflectance");
      this_00 = (MetalMaterial *)alignedUSMMalloc(0x90,0x10,DEVICE_READ_ONLY);
      MirrorMaterial::MirrorMaterial((MirrorMaterial *)this_00,&Kr);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)parms);
      if (iVar1 == 0) {
        fVar5 = Parms::getFloat(in_RCX,"d",1.0);
        Parms::getTexture((Parms *)&Kr,(char *)in_RCX);
        k.field_0._0_8_ = 0;
        k.field_0._8_8_ = 0;
        Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)0x25438d);
        Parms::getTexture((Parms *)&k,(char *)in_RCX);
        map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x3f8000003f800000;
        map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
        Parms::getVec3fa((Parms *)&Kd_1,(char *)in_RCX,(Vec3fa *)0x25439b);
        Parms::getTexture((Parms *)&map_Kd,(char *)in_RCX);
        map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Parms::getVec3fa((Parms *)&Ks_1,(char *)in_RCX,(Vec3fa *)0x2543a9);
        Parms::getTexture((Parms *)&map_Ks,(char *)in_RCX);
        map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Parms::getVec3fa((Parms *)&Kt_1,(char *)in_RCX,(Vec3fa *)0x2543b7);
        Parms::getTexture((Parms *)&map_Kt,(char *)in_RCX);
        fVar6 = Parms::getFloat(in_RCX,"Ns",10.0);
        Parms::getTexture((Parms *)&map_Ns,(char *)in_RCX);
        Parms::getTexture((Parms *)&map_Displ,(char *)in_RCX);
        pOVar3 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
        local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)Kr.field_0._0_8_;
        local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Kr.field_0._8_8_;
        if (Kr.field_0._8_8_ != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(Kr.field_0._8_8_ + 8) = *(int *)(Kr.field_0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(Kr.field_0._8_8_ + 8) = *(int *)(Kr.field_0._8_8_ + 8) + 1;
          }
        }
        local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)k.field_0._0_8_;
        local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)k.field_0._8_8_;
        if (k.field_0._8_8_ != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(k.field_0._8_8_ + 8) = *(int *)(k.field_0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(k.field_0._8_8_ + 8) = *(int *)(k.field_0._8_8_ + 8) + 1;
          }
        }
        local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        if (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        if (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        if (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        local_138.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_138.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
        if (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        OBJMaterial::OBJMaterial
                  (pOVar3,fVar5,&local_d8,&Kt,&local_e8,&Kd_1,&local_f8,&Ks_1,&local_108,&Kt_1,
                   &local_118,fVar6,&local_128,&local_138);
        (this->path).filename._M_dataplus._M_p = (pointer)pOVar3;
        (**(code **)(*(long *)&(pOVar3->super_MaterialNode).super_Node.super_RefCount + 0x10))
                  (pOVar3);
        if ((_Base_ptr)
            local_138.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (k.field_0._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)k.field_0._8_8_);
        }
        if (Kr.field_0._8_8_ == 0) {
          return (Ref<embree::SceneGraph::MaterialNode>)this;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Kr.field_0._8_8_);
        return (Ref<embree::SceneGraph::MaterialNode>)this;
      }
      iVar1 = std::__cxx11::string::compare((char *)parms);
      if (iVar1 == 0) {
        fVar5 = Parms::getFloat(in_RCX,"d",1.0);
        Kt.field_0._0_8_ = 0x3f8000003f800000;
        Kt.field_0._8_8_ = 0x3f8000003f800000;
        Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"kd");
        k.field_0._0_8_ = 0;
        k.field_0._8_8_ = 0;
        Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)0x258bf2);
        fVar6 = Parms::getFloat(in_RCX,"ns",10.0);
        pOVar3 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
        OBJMaterial::OBJMaterial(pOVar3,fVar5,&Kr,&Kt,fVar6,&local_78);
        (this->path).filename._M_dataplus._M_p = (pointer)pOVar3;
        (**(code **)(*(long *)&(pOVar3->super_MaterialNode).super_Node.super_RefCount + 0x10))
                  (pOVar3);
        _Var4._M_p = local_78._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == &local_78.field_2) {
          return (Ref<embree::SceneGraph::MaterialNode>)this;
        }
LAB_00180254:
        operator_delete(_Var4._M_p);
        return (Ref<embree::SceneGraph::MaterialNode>)this;
      }
      iVar1 = std::__cxx11::string::compare((char *)parms);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)parms), iVar1 == 0)) {
        Kt.field_0._0_8_ = 0x3f8000003f800000;
        Kt.field_0._8_8_ = 0x3f8000003f800000;
        Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"transmission");
        fVar5 = Parms::getFloat(in_RCX,"eta",1.4);
        fVar6 = Parms::getFloat(in_RCX,"thickness",0.1);
        this_00 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
        ThinDielectricMaterial::ThinDielectricMaterial
                  ((ThinDielectricMaterial *)this_00,&Kr,fVar5,fVar6);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)parms);
        if (iVar1 == 0) {
          Kt.field_0._0_8_ = 0x3f8000003f800000;
          Kt.field_0._8_8_ = 0x3f8000003f800000;
          Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"pigmentColor");
          fVar5 = Parms::getFloat(in_RCX,"eta",1.4);
          fVar6 = Parms::getFloat(in_RCX,"roughness",0.01);
          this_00 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
          MetallicPaintMaterial::MetallicPaintMaterial
                    ((MetallicPaintMaterial *)this_00,&Kr,&Kr,fVar6,fVar5);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)parms);
          if (iVar1 == 0) {
            Kt.field_0._0_8_ = 0x3f8000003f800000;
            Kt.field_0._8_8_ = 0x3f8000003f800000;
            Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"reflectance");
            k.field_0._0_8_ = 0x3fb333333fb33333;
            k.field_0._8_8_ = 0x3fb333333fb33333;
            Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)0x254498);
            Kd_1.field_0._0_8_ = 0;
            Kd_1.field_0._8_8_ = 0;
            Parms::getVec3fa((Parms *)&k,(char *)in_RCX,(Vec3fa *)0x25da25);
            fVar5 = Parms::getFloat(in_RCX,"roughness",0.01);
            this_00 = (MetalMaterial *)alignedUSMMalloc(0xc0,0x10,DEVICE_READ_ONLY);
            if ((fVar5 != 0.0) || (NAN(fVar5))) {
              MetalMaterial::MetalMaterial(this_00,&Kr,&Kt,&k,fVar5);
            }
            else {
              MetalMaterial::MetalMaterial(this_00,&Kr,&Kt,&k);
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)parms);
            if (iVar1 == 0) {
              Kt.field_0._0_8_ = 0x3f8000003f800000;
              Kt.field_0._8_8_ = 0x3f8000003f800000;
              Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"reflectance");
              fVar5 = Parms::getFloat(in_RCX,"backScattering",0.0);
              k.field_0._0_8_ = 0x3f8000003f800000;
              k.field_0._8_8_ = 0x3f8000003f800000;
              Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)"horizonScatteringColor");
              fVar6 = Parms::getFloat(in_RCX,"horizonScatteringFallOff",0.0);
              this_00 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
              VelvetMaterial::VelvetMaterial((VelvetMaterial *)this_00,&Kr,fVar5,&Kt,fVar6);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)parms);
              if (iVar1 == 0) {
                Kt.field_0._0_8_ = 0x3f8000003f800000;
                Kt.field_0._8_8_ = 0x3f8000003f800000;
                Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"transmissionOutside");
                k.field_0._0_8_ = 0x3f8000003f800000;
                k.field_0._8_8_ = 0x3f8000003f800000;
                Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)"transmission");
                fVar5 = Parms::getFloat(in_RCX,"etaOutside",1.0);
                fVar6 = Parms::getFloat(in_RCX,"etaInside",1.4);
                this_00 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
                DielectricMaterial::DielectricMaterial
                          ((DielectricMaterial *)this_00,&Kr,&Kt,fVar5,fVar6);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)parms);
                if (iVar1 == 0) {
                  Kt.field_0._0_8_ = 0x3f8000003f800000;
                  Kt.field_0._8_8_ = 0x3f8000003f800000;
                  Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"shadeColor");
                  k.field_0._0_8_ = 0;
                  k.field_0._8_8_ = 0;
                  Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)"glitterColor");
                  fVar5 = Parms::getFloat(in_RCX,"glitterSpread",1.0);
                  fVar6 = Parms::getFloat(in_RCX,"eta",1.4);
                  this_00 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
                  MetallicPaintMaterial::MetallicPaintMaterial
                            ((MetallicPaintMaterial *)this_00,&Kr,&Kt,fVar5,fVar6);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)parms);
                  if (iVar1 != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Warning: unsupported material ",0x1e);
                    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,*(char **)&(parms->m)._M_t._M_impl,
                                        *(long *)&(parms->m)._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header);
                    std::endl<char,std::char_traits<char>>(poVar2);
                    pOVar3 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
                    Kr.field_0._0_8_ = 0x3f0000003f000000;
                    Kr.field_0._8_8_ = 0x3f0000003f000000;
                    Kt.field_0._0_8_ = 0;
                    Kt.field_0._8_8_ = 0;
                    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
                    OBJMaterial::OBJMaterial(pOVar3,1.0,&Kr,&Kt,0.0,&local_98);
                    (this->path).filename._M_dataplus._M_p = (pointer)pOVar3;
                    (**(code **)(*(long *)&(pOVar3->super_MaterialNode).super_Node.super_RefCount +
                                0x10))(pOVar3);
                    _Var4._M_p = local_98._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p == &local_98.field_2) {
                      return (Ref<embree::SceneGraph::MaterialNode>)this;
                    }
                    goto LAB_00180254;
                  }
                  Kt.field_0._0_8_ = 0x3f8000003f800000;
                  Kt.field_0._8_8_ = 0x3f8000003f800000;
                  Parms::getVec3fa((Parms *)&Kr,(char *)in_RCX,(Vec3fa *)"Kr");
                  k.field_0._0_8_ = 0;
                  k.field_0._8_8_ = 0;
                  Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)0x2543b7);
                  fVar5 = Parms::getFloat(in_RCX,"nx",20.0);
                  fVar6 = Parms::getFloat(in_RCX,"ny",2.0);
                  this_00 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
                  HairMaterial::HairMaterial((HairMaterial *)this_00,&Kr,&Kt,fVar5,fVar6);
                }
              }
            }
          }
        }
      }
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_MaterialNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::addMaterial(const std::string& type, const Parms& parms) 
  {
    if (type == "Matte")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      return new MatteMaterial(reflectance);
    }
    else if (type == "Mirror")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      return new MirrorMaterial(reflectance);
    }
    else if (type == "OBJ") 
    {
      const float d = parms.getFloat("d", 1.0f);
      const std::shared_ptr<Texture> map_d = parms.getTexture("map_d");  
      const Vec3fa Ka = parms.getVec3fa("Ka", zero);
      const std::shared_ptr<Texture> map_Ka = parms.getTexture("map_Ka");  
      const Vec3fa Kd = parms.getVec3fa("Kd", one);
      const std::shared_ptr<Texture> map_Kd = parms.getTexture("map_Kd");  
      const Vec3fa Ks = parms.getVec3fa("Ks", zero);
      const std::shared_ptr<Texture> map_Ks = parms.getTexture("map_Ks");  
      const Vec3fa Kt = parms.getVec3fa("Kt", zero);
      const std::shared_ptr<Texture> map_Kt = parms.getTexture("map_Kt");  
      const float Ns = parms.getFloat("Ns", 10.0f); 
      const std::shared_ptr<Texture> map_Ns = parms.getTexture("map_Ns");  
      const std::shared_ptr<Texture> map_Displ = parms.getTexture("map_Displ");
      return new OBJMaterial(d,map_d,Ka,map_Ka,Kd,map_Kd,Ks,map_Ks,Kt,map_Kt,Ns,map_Ns,map_Displ);
    }
    else if (type == "OBJMaterial")  // for BGF file format
    {
      //map_d = parms.getTexture("map_d");  
      const float d = parms.getFloat("d", 1.0f);
      //map_Kd = parms.getTexture("map_kd");  
      const Vec3fa Kd = parms.getVec3fa("kd", one);
      //map_Ks = parms.getTexture("map_ks");  
      const Vec3fa Ks = parms.getVec3fa("ks", zero);
      //map_Ns = parms.getTexture("map_ns");  
      const float Ns = parms.getFloat("ns", 10.0f);
      //map_Bump = parms.getTexture("map_Bump");
      return new OBJMaterial(d,Kd,Ks,Ns);
    }
    else if (type == "ThinDielectric" || type == "ThinGlass")
    {
      const Vec3fa transmission = parms.getVec3fa("transmission",one);
      const float eta          = parms.getFloat("eta",1.4f);
      const float thickness    = parms.getFloat("thickness",0.1f);
      return new ThinDielectricMaterial(transmission,eta,thickness);
    }
    else if (type == "Plastic")
    {
      const Vec3fa pigmentColor = parms.getVec3fa("pigmentColor",one);
      const float eta          = parms.getFloat("eta",1.4f);
      const float roughness    = parms.getFloat("roughness",0.01f);
      return new MetallicPaintMaterial(pigmentColor,pigmentColor,roughness,eta);
    }
    else if (type == "Metal")
    {
      const Vec3fa reflectance  = parms.getVec3fa("reflectance",one);
      const Vec3fa eta          = parms.getVec3fa("eta",Vec3fa(1.4f));
      const Vec3fa k            = parms.getVec3fa("k",Vec3fa(0.0f));
      const float roughness     = parms.getFloat("roughness",0.01f);
      if (roughness == 0.0f)
        return new MetalMaterial(reflectance,eta,k);
      else 
        return new MetalMaterial(reflectance,eta,k,roughness);
    }
    else if (type == "Velvet")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      const float backScattering = parms.getFloat("backScattering",zero);
      const Vec3fa horizonScatteringColor = parms.getVec3fa("horizonScatteringColor",one);
      const float horizonScatteringFallOff = parms.getFloat("horizonScatteringFallOff",zero);
      return new VelvetMaterial(reflectance,backScattering,horizonScatteringColor,horizonScatteringFallOff);
    }
    else if (type == "Dielectric")
    {
      const Vec3fa transmissionOutside = parms.getVec3fa("transmissionOutside",one);
      const Vec3fa transmissionInside  = parms.getVec3fa("transmission",one);
      const float etaOutside = parms.getFloat("etaOutside",1.0f);
      const float etaInside  = parms.getFloat("etaInside",1.4f);
      return new DielectricMaterial(transmissionOutside,transmissionInside,etaOutside,etaInside);
    }
    else if (type == "MetallicPaint")
    {
      const Vec3fa shadeColor    = parms.getVec3fa("shadeColor",one);
      const Vec3fa glitterColor  = parms.getVec3fa("glitterColor",zero);
      const float glitterSpread = parms.getFloat("glitterSpread",1.0f);
      const float eta           = parms.getFloat("eta",1.4f);
      return new MetallicPaintMaterial(shadeColor,glitterColor,glitterSpread,eta);
    }
    else if (type == "Hair")
    {
      const Vec3fa Kr = parms.getVec3fa("Kr",one);
      const Vec3fa Kt = parms.getVec3fa("Kt",zero);
      const float nx = parms.getFloat("nx",20.0f);
      const float ny = parms.getFloat("ny",2.0f);
      return new HairMaterial(Kr,Kt,nx,ny);
    }
    else {
      std::cout << "Warning: unsupported material " << type << std::endl;
      return new OBJMaterial(1.0f,Vec3fa(0.5f),Vec3fa(0.0f),0.0f);
    }
  }